

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_drawing.h
# Opt level: O3

void dlib::draw_line<dlib::rgb_pixel>
               (canvas *c,point *p1,point *p2,rgb_pixel *pixel,rectangle *area)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  long lVar4;
  long lVar5;
  unsigned_long uVar6;
  uchar *puVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  rgb_alpha_pixel local_64;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  lVar15 = (c->super_rectangle).l;
  lVar19 = (c->super_rectangle).t;
  lVar12 = area->l;
  if (area->l < lVar15) {
    lVar12 = lVar15;
  }
  lVar9 = area->t;
  if (area->t < lVar19) {
    lVar9 = lVar19;
  }
  lVar18 = (c->super_rectangle).r;
  if (area->r < lVar18) {
    lVar18 = area->r;
  }
  lVar11 = (c->super_rectangle).b;
  if (area->b < lVar11) {
    lVar11 = area->b;
  }
  lVar4 = (p1->
          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          ).data.data[0];
  lVar5 = (p1->
          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          ).data.data[1];
  lVar13 = (p2->
           super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
           ).data.data[0];
  lVar10 = (p2->
           super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
           ).data.data[1];
  uVar16 = lVar13 - lVar4;
  if (uVar16 == 0) {
    if (lVar12 <= lVar4 && lVar4 <= lVar18) {
      lVar12 = lVar10;
      if (lVar10 < lVar5) {
        lVar12 = lVar5;
      }
      if (lVar5 < lVar10) {
        lVar10 = lVar5;
      }
      if (lVar10 <= lVar9) {
        lVar10 = lVar9;
      }
      if (lVar11 < lVar12) {
        lVar12 = lVar11;
      }
      if (lVar10 <= lVar12) {
        uVar6 = c->row_width;
        uVar1 = pixel->red;
        uVar2 = pixel->green;
        uVar3 = pixel->blue;
        lVar12 = (lVar12 - lVar10) + 1;
        puVar7 = c->bits + (lVar10 - lVar19) * uVar6 + lVar4 * 4 + lVar15 * -4 + 2;
        do {
          *puVar7 = uVar1;
          puVar7[-1] = uVar2;
          puVar7[-2] = uVar3;
          puVar7 = puVar7 + uVar6;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
    }
  }
  else {
    uVar17 = lVar10 - lVar5;
    if (uVar17 == 0) {
      if (lVar9 <= lVar5 && lVar5 <= lVar11) {
        lVar9 = lVar13;
        if (lVar13 < lVar4) {
          lVar9 = lVar4;
        }
        if (lVar4 < lVar13) {
          lVar13 = lVar4;
        }
        if (lVar13 <= lVar12) {
          lVar13 = lVar12;
        }
        if (lVar18 < lVar9) {
          lVar9 = lVar18;
        }
        if (lVar13 <= lVar9) {
          puVar7 = c->bits;
          uVar1 = pixel->red;
          uVar2 = pixel->green;
          uVar3 = pixel->blue;
          lVar15 = (lVar5 - lVar19) * c->row_width + lVar15 * -4;
          do {
            puVar7[lVar13 * 4 + lVar15 + 2] = uVar1;
            puVar7[lVar13 * 4 + lVar15 + 1] = uVar2;
            puVar7[lVar13 * 4 + lVar15] = uVar3;
            lVar13 = lVar13 + 1;
          } while (lVar9 + 1 != lVar13);
        }
      }
    }
    else {
      local_64.red = pixel->red;
      local_64.green = pixel->green;
      local_64.blue = pixel->blue;
      uVar8 = -uVar17;
      if (0 < (long)uVar17) {
        uVar8 = uVar17;
      }
      uVar14 = -uVar16;
      if (0 < (long)uVar16) {
        uVar14 = uVar16;
      }
      local_38 = (double)lVar4;
      local_40 = (double)lVar5;
      if (uVar8 < uVar14) {
        lVar15 = lVar13;
        if (lVar4 < lVar13) {
          lVar15 = lVar4;
        }
        if (lVar13 < lVar4) {
          lVar13 = lVar4;
        }
        if (lVar15 <= lVar12) {
          lVar15 = lVar12;
        }
        local_60 = (double)lVar15;
        if (lVar18 < lVar13) {
          lVar13 = lVar18;
        }
        local_48 = (double)lVar13;
        if (local_60 <= local_48) {
          local_50 = (double)(long)uVar17 / (double)(long)uVar16;
          do {
            dVar20 = (local_60 - local_38) * local_50 + local_40;
            lVar15 = (long)dVar20;
            lVar19 = (long)local_60;
            if (lVar15 <= lVar11 && lVar9 <= lVar15) {
              local_64.alpha = (uchar)(int)((((double)lVar15 - dVar20) + 1.0) * 255.0);
              local_58 = dVar20;
              assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                        ((pixel *)(c->bits +
                                  (lVar19 - (c->super_rectangle).l) * 4 +
                                  (lVar15 - (c->super_rectangle).t) * c->row_width),&local_64);
              dVar20 = local_58;
            }
            if (lVar15 < lVar11 && lVar9 <= lVar15 + 1) {
              local_64.alpha = (uchar)(int)((dVar20 - (double)lVar15) * 255.0);
              assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                        ((pixel *)(c->bits +
                                  (lVar19 - (c->super_rectangle).l) * 4 +
                                  ((lVar15 + 1) - (c->super_rectangle).t) * c->row_width),&local_64)
              ;
            }
            local_60 = local_60 + 1.0;
          } while (local_60 <= local_48);
        }
      }
      else {
        lVar15 = lVar10;
        if (lVar5 < lVar10) {
          lVar15 = lVar5;
        }
        if (lVar10 < lVar5) {
          lVar10 = lVar5;
        }
        if (lVar15 <= lVar9) {
          lVar15 = lVar9;
        }
        local_60 = (double)lVar15;
        if (lVar11 < lVar10) {
          lVar10 = lVar11;
        }
        local_48 = (double)lVar10;
        if (local_60 <= local_48) {
          local_50 = (double)(long)uVar16 / (double)(long)uVar17;
          do {
            lVar19 = (long)local_60;
            dVar20 = (local_60 - local_40) * local_50 + local_38;
            lVar15 = (long)dVar20;
            if (lVar15 <= lVar18 && lVar12 <= lVar15) {
              local_64.alpha = (uchar)(int)((((double)lVar15 - dVar20) + 1.0) * 255.0);
              local_58 = dVar20;
              assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                        ((pixel *)(c->bits +
                                  (lVar15 - (c->super_rectangle).l) * 4 +
                                  (lVar19 - (c->super_rectangle).t) * c->row_width),&local_64);
              dVar20 = local_58;
            }
            if (lVar15 < lVar18 && lVar12 <= lVar15 + 1) {
              local_64.alpha = (uchar)(int)((dVar20 - (double)lVar15) * 255.0);
              assign_pixel_helpers::assign<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                        ((pixel *)(c->bits +
                                  ((lVar15 + 1) - (c->super_rectangle).l) * 4 +
                                  (lVar19 - (c->super_rectangle).t) * c->row_width),&local_64);
            }
            local_60 = local_60 + 1.0;
          } while (local_60 <= local_48);
        }
      }
    }
  }
  return;
}

Assistant:

void draw_line (
        const canvas& c,
        const point& p1,
        const point& p2,
        const pixel_type& pixel, 
        const rectangle& area = rectangle(std::numeric_limits<long>::min(), std::numeric_limits<long>::min(),
                                          std::numeric_limits<long>::max(), std::numeric_limits<long>::max())
    )
    {
        rectangle valid_area(c.intersect(area));
        long x1 = p1.x();
        long y1 = p1.y();
        long x2 = p2.x();
        long y2 = p2.y();
        if (x1 == x2)
        {
            // if the x coordinate is inside the canvas's area
            if (x1 <= valid_area.right() && x1 >= valid_area.left())
            {
                // make sure y1 comes before y2
                if (y1 > y2)
                    swap(y1,y2);

                y1 = std::max(y1,valid_area.top());
                y2 = std::min(y2,valid_area.bottom());
                // this is a vertical line
                for (long y = y1; y <= y2; ++y)
                {
                    assign_pixel(c[y-c.top()][x1-c.left()], pixel);
                }
            }
        }
        else if (y1 == y2)
        {
            // if the y coordinate is inside the canvas's area
            if (y1 <= valid_area.bottom() && y1 >= valid_area.top())
            {
                // make sure x1 comes before x2
                if (x1 > x2)
                    swap(x1,x2);

                x1 = std::max(x1,valid_area.left());
                x2 = std::min(x2,valid_area.right());
                // this is a horizontal line
                for (long x = x1; x <= x2; ++x)
                {
                    assign_pixel(c[y1-c.top()][x-c.left()], pixel);
                }
            }
        }
        else
        {
            rgb_alpha_pixel alpha_pixel;
            assign_pixel(alpha_pixel, pixel);
            const unsigned char max_alpha = alpha_pixel.alpha;

            const long rise = (((long)y2) - ((long)y1));
            const long run = (((long)x2) - ((long)x1));
            if (std::abs(rise) < std::abs(run))
            {
                const double slope = ((double)rise)/run;

                double first, last;

                if (x1 > x2)                
                {
                    first = std::max(x2,valid_area.left());
                    last = std::min(x1,valid_area.right());
                }
                else
                {
                    first = std::max(x1,valid_area.left());
                    last = std::min(x2,valid_area.right());
                }                             


                long y;
                long x;
                const double x1f = x1;
                const double y1f = y1;
                for (double i = first; i <= last; ++i)
                {   
                    const double dy = slope*(i-x1f) + y1f;
                    const double dx = i;

                    y = static_cast<long>(dy);
                    x = static_cast<long>(dx);


                    if (y >= valid_area.top() && y <= valid_area.bottom())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((1.0-(dy-y))*max_alpha);
                        assign_pixel(c[y-c.top()][x-c.left()], alpha_pixel);
                    }
                    if (y+1 >= valid_area.top() && y+1 <= valid_area.bottom())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((dy-y)*max_alpha);
                        assign_pixel(c[y+1-c.top()][x-c.left()], alpha_pixel);
                    }
                }         
            }
            else
            {
                const double slope = ((double)run)/rise;

                double first, last;

                if (y1 > y2)                
                {
                    first = std::max(y2,valid_area.top());
                    last = std::min(y1,valid_area.bottom());
                }
                else
                {
                    first = std::max(y1,valid_area.top());
                    last = std::min(y2,valid_area.bottom());
                }                             

                long x;
                long y;
                const double x1f = x1;
                const double y1f = y1;
                for (double i = first; i <= last; ++i)
                {   
                    const double dx = slope*(i-y1f) + x1f;
                    const double dy = i;

                    y = static_cast<long>(dy);
                    x = static_cast<long>(dx);

                    if (x >= valid_area.left() && x <= valid_area.right())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((1.0-(dx-x))*max_alpha);
                        assign_pixel(c[y-c.top()][x-c.left()], alpha_pixel);
                    }
                    if (x+1 >= valid_area.left() && x+1 <= valid_area.right())
                    {
                        alpha_pixel.alpha = static_cast<unsigned char>((dx-x)*max_alpha);
                        assign_pixel(c[y-c.top()][x+1-c.left()], alpha_pixel);
                    }
                } 
            }
        }

    }